

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void ptc::(anonymous_namespace)::print_adaptor<std::deque<int,std::allocator<int>>,char>
               (basic_ostream<char,_std::char_traits<char>_> *os,
               deque<int,_std::allocator<int>_> *container)

{
  bool bVar1;
  conditional_t<std::is_same_v<char,_char>,_const_std::basic_string<char>_&,_std::basic_string<char>_>
  pbVar2;
  ostream *this;
  reference piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Self local_c8;
  const_iterator local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> separator;
  const_iterator beg;
  deque<int,_std::allocator<int>_> *container_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  std::deque<int,_std::allocator<int>_>::begin
            ((const_iterator *)((long)&separator.field_2 + 8),container);
  s_abi_cxx11_(&local_78,"",0);
  pbVar2 = anon_unknown_8::StringConverter<char>(&local_78);
  std::__cxx11::string::string(local_58,(string *)pbVar2);
  std::__cxx11::string::~string((string *)&local_78);
  while( true ) {
    std::deque<int,_std::allocator<int>_>::end(&local_a8,container);
    bVar1 = std::operator!=((_Self *)((long)&separator.field_2 + 8),&local_a8);
    if (!bVar1) break;
    this = std::operator<<(os,local_58);
    std::_Deque_iterator<int,_const_int_&,_const_int_*>::operator++
              (&local_c8,
               (_Deque_iterator<int,_const_int_&,_const_int_*> *)((long)&separator.field_2 + 8),0);
    piVar3 = std::_Deque_iterator<int,_const_int_&,_const_int_*>::operator*(&local_c8);
    std::ostream::operator<<(this,*piVar3);
    s_abi_cxx11_(&local_e8,", ",2);
    pbVar2 = anon_unknown_8::StringConverter<char>(&local_e8);
    std::__cxx11::string::operator=(local_58,(string *)pbVar2);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void print_adaptor( std::basic_ostream<T_str>& os, const Container& container )
     {
      typename Container::const_iterator beg = container.begin();
      std::basic_string<T_str> separator = StringConverter<T_str>( ""s );
      
      while( beg != container.end() )
       {
        os << separator << *beg++;
        separator = StringConverter<T_str>( ", "s );
       }
     }